

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O3

bool __thiscall
tinyusdz::GeomPrimvar::get_value<std::array<double,4ul>>
          (GeomPrimvar *this,array<double,_4UL> *dest,string *err)

{
  Attribute *this_00;
  vtable_type *pvVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 *puVar5;
  byte bVar6;
  bool bVar7;
  uint32_t uVar8;
  pointer pSVar9;
  array<double,_4UL> *paVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  undefined7 uVar11;
  pointer pSVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  undefined1 local_a8 [44];
  undefined1 local_7c [4];
  undefined8 *local_78;
  undefined8 local_68 [3];
  string local_50;
  
  if (dest == (array<double,_4UL> *)0x0) {
joined_r0x001b9f7c:
    if (err != (string *)0x0) {
      std::__cxx11::string::append((char *)err);
    }
  }
  else {
    if ((this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar1 = (this->_attr)._var._value.v_.vtable;
      if (pvVar1 == (vtable_type *)0x0) {
        bVar7 = false;
        uVar11 = 0;
      }
      else {
        uVar8 = (*pvVar1->type_id)();
        bVar7 = uVar8 == 4;
        uVar11 = (undefined7)((ulong)in_RCX >> 8);
      }
      bVar6 = (this->_attr)._var._blocked;
      in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71(uVar11,bVar7 | bVar6);
      if (bVar7 != false || (bVar6 & 1) != 0) goto joined_r0x001b9f7c;
    }
    else {
      bVar6 = (this->_attr)._var._blocked;
    }
    if ((((bVar6 & 1) == 0) &&
        (pvVar1 = (this->_attr)._var._value.v_.vtable, pvVar1 != (vtable_type *)0x0)) &&
       ((uVar8 = (*pvVar1->type_id)(), uVar8 == 0 ||
        ((pvVar1 = (this->_attr)._var._value.v_.vtable, pvVar1 != (vtable_type *)0x0 &&
         (uVar8 = (*pvVar1->type_id)(), uVar8 == 1)))))) {
      pSVar12 = (this->_attr)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar9 = (this->_attr)._var._ts._samples.
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pSVar9 != pSVar12) {
        if ((this->_attr)._var._ts._dirty == true) {
          tinyusdz::value::TimeSamples::update(&(this->_attr)._var._ts);
          pSVar12 = (this->_attr)._var._ts._samples.
                    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar9 = (this->_attr)._var._ts._samples.
                   super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        if (pSVar9 != pSVar12) {
          paVar10 = tinyusdz::value::Value::as<std::array<double,4ul>>(&pSVar12->value,false);
          if (paVar10 == (array<double,_4UL> *)0x0) {
            return false;
          }
          dVar2 = paVar10->_M_elems[0];
          dVar3 = paVar10->_M_elems[1];
          dVar4 = paVar10->_M_elems[3];
          dest->_M_elems[2] = paVar10->_M_elems[2];
          dest->_M_elems[3] = dVar4;
          dest->_M_elems[0] = dVar2;
          dest->_M_elems[1] = dVar3;
          return true;
        }
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
      }
    }
    else {
      this_00 = &this->_attr;
      uVar8 = Attribute::type_id(this_00);
      bVar7 = IsSupportedGeomPrimvarType(uVar8);
      if (bVar7) {
        primvar::PrimVar::get_value<std::array<double,4ul>>
                  ((optional<std::array<double,_4UL>_> *)local_a8,&(this->_attr)._var);
        bVar7 = local_a8[0];
        if (local_a8[0] == true) {
          dest->_M_elems[2] = (double)CONCAT17(local_a8[0x1f],local_a8._24_7_);
          dest->_M_elems[3] = (double)CONCAT17(local_a8[0x27],local_a8._32_7_);
          dest->_M_elems[0] = (double)CONCAT17(local_a8[0xf],local_a8._8_7_);
          dest->_M_elems[1] = (double)CONCAT17(local_a8[0x17],local_a8._16_7_);
          return true;
        }
        if (err == (string *)0x0) {
          return local_a8[0];
        }
        local_78 = local_68;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,
                   "Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`",
                   "");
        local_7c = (undefined1  [4])0x2f;
        Attribute::type_name_abi_cxx11_(&local_50,this_00);
        fmt::format<unsigned_int,std::__cxx11::string>
                  ((string *)local_a8,(fmt *)&local_78,(string *)local_7c,(uint *)&local_50,in_R8);
        std::__cxx11::string::_M_append
                  ((char *)err,CONCAT17(local_a8[7],CONCAT61(local_a8._1_6_,local_a8[0])));
        puVar5 = (undefined1 *)CONCAT17(local_a8[7],CONCAT61(local_a8._1_6_,local_a8[0]));
        if (puVar5 != local_a8 + 0x10) {
          operator_delete(puVar5,CONCAT17(local_a8[0x17],local_a8._16_7_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (local_78 == local_68) {
          return bVar7;
        }
        operator_delete(local_78,local_68[0] + 1);
        return bVar7;
      }
      if (err != (string *)0x0) {
        local_78 = local_68;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"Unsupported type for GeomPrimvar. type = `{}`","");
        Attribute::type_name_abi_cxx11_(&local_50,this_00);
        fmt::format<std::__cxx11::string>((string *)local_a8,(fmt *)&local_78,&local_50,in_RCX);
        std::__cxx11::string::_M_append
                  ((char *)err,CONCAT17(local_a8[7],CONCAT61(local_a8._1_6_,local_a8[0])));
        puVar5 = (undefined1 *)CONCAT17(local_a8[7],CONCAT61(local_a8._1_6_,local_a8[0]));
        if (puVar5 != local_a8 + 0x10) {
          operator_delete(puVar5,CONCAT17(local_a8[0x17],local_a8._16_7_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (local_78 != local_68) {
          operator_delete(local_78,local_68[0] + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool GeomPrimvar::get_value(T *dest, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (_attr.has_value()) {
    if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
      if (err) {
        (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                              _attr.type_name());
      }
      return false;
    }

    if (auto pv = _attr.get_value<T>()) {

      // copy
      (*dest) = pv.value();
      return true;

    } else {
      if (err) {
        (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }
  }

  if (_attr.has_timesamples()) {
    // Return the first sample.
    const auto &ts = _attr.get_var().ts_raw();
    if (ts.empty()) {
      if (err) {
        (*err) += "No TimeSample value in Attribute..";
      }
      return false;
    }
    
    if (auto pv =ts.get_samples().at(0).value.as<T>()) {
      (*dest) = (*pv);
      return true;
    }
  }

  return false;
}